

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

void mcu8str_append_cstr(mcu8str *str,char *c_str)

{
  mcu8str_size_t nsize;
  mcu8str_size_t __n;
  
  __n = mctools_strlen(c_str,0);
  if (__n != 0) {
    nsize = __n + str->size;
    if ((ulong)str->buflen < str->size + __n + 1) {
      mcu8str_reserve(str,nsize);
    }
    memcpy(str->c_str + str->size,c_str,__n);
    str->c_str[nsize] = '\0';
    str->size = (uint)nsize;
  }
  return;
}

Assistant:

void mcu8str_append_cstr( mcu8str* str, const char * c_str )
  {
    const mcu8str_size_t o_size = mctools_strlen( c_str, 0 );
    if ( o_size == 0 )
      return;
    const mcu8str_size_t newsize = str->size + o_size;
    if ( newsize + 1 > str->buflen )
      mcu8str_reserve( str, newsize );
    //memcpy ok since we handle the null char afterwards, there will be no
    //overlapping even if c_str = str.c_str:
    STDNS memcpy( str->c_str + str->size, c_str, o_size );
    str->c_str[newsize] = '\0';
    str->size = (unsigned)newsize;//cast ok, mcu8str_reserve checked.
  }